

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_model.c
# Opt level: O3

void HTS_ModelSet_get_gv(HTS_ModelSet *ms,size_t stream_index,char *string,double **iw,double *mean,
                        double *vari)

{
  double weight;
  size_t sVar1;
  ulong uVar2;
  size_t sVar3;
  ulong uVar4;
  
  sVar1 = (*ms->stream)[stream_index].vector_length;
  if (sVar1 != 0) {
    sVar3 = 0;
    do {
      mean[sVar3] = 0.0;
      vari[sVar3] = 0.0;
      sVar3 = sVar3 + 1;
    } while (sVar1 != sVar3);
  }
  uVar2 = ms->num_voices;
  if (uVar2 != 0) {
    uVar4 = 0;
    do {
      weight = iw[uVar4][stream_index];
      if ((weight != 0.0) || (NAN(weight))) {
        HTS_Model_add_parameter
                  (ms->gv[uVar4] + stream_index,2,string,mean,vari,(double *)0x0,weight);
        uVar2 = ms->num_voices;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < uVar2);
  }
  return;
}

Assistant:

void HTS_ModelSet_get_gv(HTS_ModelSet * ms, size_t stream_index, const char *string, const double *const *iw, double *mean, double *vari)
{
   size_t i;
   size_t len = ms->stream[0][stream_index].vector_length;

   for (i = 0; i < len; i++) {
      mean[i] = 0.0;
      vari[i] = 0.0;
   }
   for (i = 0; i < ms->num_voices; i++)
      if (iw[i][stream_index] != 0.0)
         HTS_Model_add_parameter(&ms->gv[i][stream_index], 2, string, mean, vari, NULL, iw[i][stream_index]);
}